

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

string_t __thiscall
duckdb::StrfTimeFormat::ConvertTimestampValue
          (StrfTimeFormat *this,timestamp_ns_t *input,Vector *result)

{
  timestamp_ns_t input_00;
  Vector *vector;
  idx_t len;
  char *target;
  anon_union_16_2_67f50693_for_value aVar1;
  int32_t nanos;
  date_t date;
  dtime_t time;
  string sStack_78;
  int local_50;
  date_t local_4c;
  dtime_t local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  input_00 = (timestamp_ns_t)(input->super_timestamp_t).value;
  if ((input_00.super_timestamp_t.value == -0x7fffffffffffffff) ||
     (input_00.super_timestamp_t.value == 0x7fffffffffffffff)) {
    Timestamp::ToString_abi_cxx11_
              (&sStack_78,(Timestamp *)input_00.super_timestamp_t.value,(timestamp_t)result);
    aVar1.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(result,&sStack_78);
    ::std::__cxx11::string::~string((string *)&sStack_78);
    local_40.pointer = aVar1.pointer;
  }
  else {
    Timestamp::Convert(input_00,&local_4c,&local_48,&local_50);
    Date::Convert(local_4c,(int32_t *)&sStack_78,(int32_t *)((long)&sStack_78._M_dataplus._M_p + 4),
                  (int32_t *)&sStack_78._M_string_length);
    Time::Convert(local_48,(int32_t *)((long)&sStack_78._M_string_length + 4),
                  (int32_t *)sStack_78.field_2._M_local_buf,
                  (int32_t *)(sStack_78.field_2._M_local_buf + 4),
                  (int32_t *)(sStack_78.field_2._M_local_buf + 8));
    sStack_78.field_2._8_4_ = sStack_78.field_2._8_4_ * 1000 + local_50;
    sStack_78.field_2._12_4_ = 0;
    vector = (Vector *)GetLength(this,local_4c,(int32_t *)&sStack_78,(char *)0x0);
    local_40.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString((StringVector *)result,vector,len);
    target = local_40.pointer.prefix;
    if (0xc < local_40.pointer.length) {
      target = local_40.pointer.ptr;
    }
    FormatStringNS(this,local_4c,(int32_t *)&sStack_78,(char *)0x0,target);
    string_t::Finalize((string_t *)&local_40.pointer);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_40.pointer;
}

Assistant:

string_t StrfTimeFormat::ConvertTimestampValue(const timestamp_ns_t &input, Vector &result) const {
	if (Timestamp::IsFinite(input)) {
		date_t date;
		dtime_t time;
		int32_t nanos;
		Timestamp::Convert(input, date, time, nanos);

		int32_t data[8]; // year, month, day, hour, min, sec, ns, offset
		Date::Convert(date, data[0], data[1], data[2]);
		Time::Convert(time, data[3], data[4], data[5], data[6]);
		data[6] *= Interval::NANOS_PER_MICRO;
		data[6] += nanos;
		data[7] = 0;
		const char *tz_name = nullptr;

		idx_t len = GetLength(date, data, tz_name);
		string_t target = StringVector::EmptyString(result, len);
		FormatStringNS(date, data, tz_name, target.GetDataWriteable());
		target.Finalize();
		return target;
	} else {
		return StringVector::AddString(result, Timestamp::ToString(input));
	}
}